

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_generateSequences
                 (ZSTD_CCtx *zc,ZSTD_Sequence *outSeqs,size_t outSeqsSize,void *src,size_t srcSize)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  size_t sVar1;
  void *dst;
  
  sVar1 = ZSTD_compressBound(srcSize);
  customMem.opaque = (void *)0x0;
  customMem.customAlloc = (ZSTD_allocFunction)0x0;
  customMem.customFree = (ZSTD_freeFunction)0x0;
  dst = ZSTD_customMalloc(sVar1,customMem);
  if (dst == (void *)0x0) {
    sVar1 = 0xffffffffffffffc0;
  }
  else {
    (zc->seqCollector).collectSequences = 1;
    (zc->seqCollector).seqStart = outSeqs;
    (zc->seqCollector).seqIndex = 0;
    (zc->seqCollector).maxSequences = outSeqsSize;
    ZSTD_compress2(zc,dst,sVar1,src,srcSize);
    customMem_00.opaque = (void *)0x0;
    customMem_00.customAlloc = (ZSTD_allocFunction)0x0;
    customMem_00.customFree = (ZSTD_freeFunction)0x0;
    ZSTD_customFree(dst,customMem_00);
    sVar1 = (zc->seqCollector).seqIndex;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_generateSequences(ZSTD_CCtx* zc, ZSTD_Sequence* outSeqs,
                              size_t outSeqsSize, const void* src, size_t srcSize)
{
    const size_t dstCapacity = ZSTD_compressBound(srcSize);
    void* dst = ZSTD_customMalloc(dstCapacity, ZSTD_defaultCMem);
    SeqCollector seqCollector;

    RETURN_ERROR_IF(dst == NULL, memory_allocation, "NULL pointer!");

    seqCollector.collectSequences = 1;
    seqCollector.seqStart = outSeqs;
    seqCollector.seqIndex = 0;
    seqCollector.maxSequences = outSeqsSize;
    zc->seqCollector = seqCollector;

    ZSTD_compress2(zc, dst, dstCapacity, src, srcSize);
    ZSTD_customFree(dst, ZSTD_defaultCMem);
    return zc->seqCollector.seqIndex;
}